

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

void __thiscall QLineEditIconButton::paintEvent(QLineEditIconButton *this,QPaintEvent *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  double dVar6;
  QLineEditPrivate *this_00;
  long in_FS_OFFSET;
  int iVar7;
  int iVar9;
  undefined1 auVar8 [16];
  int iVar10;
  int iVar12;
  undefined1 auVar11 [16];
  SideWidgetParameters SVar13;
  QSize iconSize;
  QPainter painter;
  QRectF local_a8;
  int local_88;
  int iStack_84;
  QRectF local_80;
  undefined8 uStack_60;
  undefined1 local_58 [24];
  double dStack_40;
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  local_80.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_80,
                     &(this->super_QToolButton).super_QAbstractButton.super_QWidget.
                      super_QPaintDevice);
  if ((((this->super_QToolButton).super_QAbstractButton.super_QWidget.data)->widget_attributes & 1)
      == 0) {
    QAbstractButton::isDown((QAbstractButton *)this);
  }
  this_00 = lineEditPrivate(this);
  if (this_00 == (QLineEditPrivate *)0x0) {
    local_88 = 0x10;
  }
  else {
    SVar13 = QLineEditPrivate::sideWidgetParameters(this_00);
    local_88 = SVar13.iconSize;
  }
  local_a8.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  iStack_84 = local_88;
  QAbstractButton::icon((QAbstractButton *)local_58);
  dVar6 = (double)QPaintDevice::devicePixelRatio();
  QIcon::pixmap((QSize *)&local_a8,dVar6,(Mode)(QAbstractButton *)local_58,(State)&local_88);
  QIcon::~QIcon((QIcon *)local_58);
  pQVar5 = (this->super_QToolButton).super_QAbstractButton.super_QWidget.data;
  uVar1 = (pQVar5->crect).x2;
  uVar3 = (pQVar5->crect).y2;
  uVar2 = (pQVar5->crect).x1;
  uVar4 = (pQVar5->crect).y1;
  iVar7 = (int)(uVar1 - uVar2) / 2 - (local_88 + -1) / 2;
  iVar9 = (int)(uVar3 - uVar4) / 2 - (iStack_84 + -1) / 2;
  auVar11._4_4_ = iVar9;
  auVar11._0_4_ = iVar7;
  iVar10 = local_88 + -1 + iVar7;
  iVar12 = iStack_84 + -1 + iVar9;
  QPainter::setOpacity(this->m_opacity);
  local_58._8_4_ = SUB84((double)iVar9,0);
  local_58._0_8_ = (double)iVar7;
  local_58._12_4_ = (int)((ulong)(double)iVar9 >> 0x20);
  auVar8._4_4_ = iVar12;
  auVar8._0_4_ = iVar10;
  auVar8._8_4_ = iVar12;
  auVar8._12_4_ = -(uint)(iVar12 < 0);
  auVar11._8_4_ = iVar9;
  auVar11._12_4_ = -(uint)(iVar9 < 0);
  local_58._16_8_ =
       (undefined8)((CONCAT44(-(uint)(iVar10 < 0),iVar10) - CONCAT44(-(uint)(iVar7 < 0),iVar7)) + 1)
  ;
  dStack_40 = (double)((auVar8._8_8_ - auVar11._8_8_) + 1);
  local_80.h = 0.0;
  uStack_60 = 0;
  local_80.yp = 0.0;
  local_80.w = 0.0;
  QPainter::drawPixmap(&local_80,(QPixmap *)local_58,&local_a8);
  QPixmap::~QPixmap((QPixmap *)&local_a8);
  QPainter::~QPainter((QPainter *)&local_80);
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditIconButton::paintEvent(QPaintEvent *)
{
    QPainter painter(this);
    QIcon::Mode state = QIcon::Disabled;
    if (isEnabled())
        state = isDown() ? QIcon::Active : QIcon::Normal;
    const QLineEditPrivate *lep = lineEditPrivate();
    const int iconWidth = lep ? lep->sideWidgetParameters().iconSize : 16;
    const QSize iconSize(iconWidth, iconWidth);
    const QPixmap iconPixmap = icon().pixmap(iconSize, devicePixelRatio(), state, QIcon::Off);
    QRect pixmapRect = QRect(QPoint(0, 0), iconSize);
    pixmapRect.moveCenter(rect().center());
    painter.setOpacity(m_opacity);
    painter.drawPixmap(pixmapRect, iconPixmap);
}